

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

string * __thiscall
XipFile::XipEntry::name_abi_cxx11_(string *__return_storage_ptr__,XipEntry *this,XipFile *xip)

{
  ReadWriter_ptr r;
  undefined1 auStack_38 [32];
  
  if (this->_rvaname == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)auStack_38);
  }
  else {
    getrvareader((XipFile *)auStack_38,(uint32_t)xip,this->_rvaname);
    std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 0x10),
               (__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)auStack_38);
    readstr<std::shared_ptr<ReadWriter>>
              (__return_storage_ptr__,(shared_ptr<ReadWriter> *)(auStack_38 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 0x18));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string name(XipFile& xip)
        {
            if (_rvaname==0)
                return "";
            ReadWriter_ptr r= xip.getrvareader(_rvaname, 260);
            return readstr(r);
        }